

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SW2048Game.cpp
# Opt level: O1

void __thiscall SW2048Game::restart(SW2048Game *this)

{
  int iVar1;
  int iVar2;
  
  this->score = 0;
  this->maxCell = 0;
  initBoard(this);
  iVar1 = randomGenerate(this,2);
  iVar2 = this->maxCell;
  if (this->maxCell < iVar1) {
    iVar2 = iVar1;
  }
  this->maxCell = iVar2;
  copyToLast(this);
  this->playing = true;
  return;
}

Assistant:

void SW2048Game::restart() {
	int rNum;
	score = 0;
	maxCell = 0;
	initBoard();
	rNum = randomGenerate(2);
	maxCell = rNum > maxCell ? rNum : maxCell;
	copyToLast();
	playing = true;
}